

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O0

bool __thiscall MP1Node::joinReqHandler(MP1Node *this,void *env,char *data,int size)

{
  long heartbeat_00;
  bool bVar1;
  short port_00;
  int iVar2;
  ostream *poVar3;
  string local_b8 [34];
  short local_96;
  short port;
  string local_88 [36];
  int local_64;
  string local_60 [4];
  int id;
  string reqAddStr;
  long heartbeat;
  undefined2 local_30;
  Address requesterAddress;
  int size_local;
  char *data_local;
  void *env_local;
  MP1Node *this_local;
  
  requesterAddress.addr._0_4_ = size;
  unique0x100001e6 = (long *)data;
  poVar3 = std::operator<<((ostream *)&std::cout,"start joinReqHandler...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  bVar1 = 0xd < (int)requesterAddress.addr._0_4_;
  if (bVar1) {
    Address::Address((Address *)((long)&heartbeat + 4));
    local_30 = *(undefined2 *)((long)stack0xffffffffffffffd8 + 4);
    heartbeat._4_4_ = *(undefined4 *)stack0xffffffffffffffd8;
    register0x00000000 = (long *)((long)stack0xffffffffffffffd8 + 6);
    requesterAddress.addr._0_4_ = requesterAddress.addr._0_4_ + -6;
    heartbeat_00 = *register0x00000000;
    Address::getAddress_abi_cxx11_((Address *)local_60);
    std::__cxx11::string::string(local_88,local_60);
    iVar2 = getIdFromAddress(this,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    local_64 = iVar2;
    std::__cxx11::string::string(local_b8,local_60);
    port_00 = getPortFromAddress(this,(string *)local_b8);
    std::__cxx11::string::~string(local_b8);
    local_96 = port_00;
    updateMembershipList(this,local_64,port_00,heartbeat_00);
    sendMembershipList(this,(Address *)((long)&heartbeat + 4),JOINREP);
    poVar3 = std::operator<<((ostream *)&std::cout,"...end joinReqHandler.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  else {
    Log::LOG(this->log,&this->memberNode->addr,"Message JOINREQ received with size wrong. Ignored.")
    ;
  }
  return bVar1;
}

Assistant:

bool MP1Node::joinReqHandler(void *env, char *data, int size) {
    cout << "start joinReqHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr) + sizeof(long))) {
#ifdef DEBUGLOG
        log->LOG(&memberNode->addr, "Message JOINREQ received with size wrong. Ignored.");
#endif
        return false;
    }

    //Get requester information
    //message structure ---> MsgType, address, number of members, member data (id, port, heartbeat)
    Address requesterAddress;
    memcpy(requesterAddress.addr, data, sizeof(memberNode->addr.addr));     //extract requester's Address from data
    data += sizeof(memberNode->addr.addr);
    size -= sizeof(memberNode->addr.addr);

    long heartbeat;
    memcpy(&heartbeat, data, sizeof(long));   //extract heartbeat from data
    //data += sizeof(long);
    //size -= sizeof(long);

    //Get id and port
    string reqAddStr = (requesterAddress.getAddress());
    int id = getIdFromAddress(reqAddStr);
    short port = getPortFromAddress(reqAddStr);

    //update the member in the membership list
    updateMembershipList(id, port, heartbeat);

    //send membership list to requester
    sendMembershipList(&requesterAddress, JOINREP);

    cout << "...end joinReqHandler." << endl;
    return true;
}